

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *s)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  ulong uVar4;
  
  sVar2 = s->_M_string_length;
  uVar3 = 0xffffffffffffffff;
  do {
    uVar4 = sVar2;
    if (uVar3 - sVar2 == -1) break;
    iVar1 = isspace((uint)(byte)(s->_M_dataplus)._M_p[uVar3 + 1]);
    uVar3 = uVar3 + 1;
    uVar4 = uVar3;
  } while (iVar1 != 0);
  while ((uVar4 < sVar2 && (iVar1 = isspace((uint)(byte)(s->_M_dataplus)._M_p[sVar2]), iVar1 != 0)))
  {
    sVar2 = sVar2 - 1;
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)s);
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim(std::string s) {
    auto bg = 0;
    auto ed = s.size();
    // bg = s.find_first_not_of(" \n\r\t\v\f");
    // bg = bg == std::string::npos? 0 : bg;
    for (;bg < ed; ++bg) {
        if (!isspace(static_cast<unsigned char>(s[bg]))) {
            break;
        }
    }
    // ed = s.find_last_not_of(" \n\r\t\v\f");
    // ed = ed == std::string::npos? s.size() : ed+1;
    for (; ed > bg; --ed) {
        if (!isspace(static_cast<unsigned char>(s[ed]))) {
            break;
        }
    }
    return s.substr(bg, ed-bg);
}